

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void transform_info_imp(transform_display *dp,png_structp pp,png_infop pi)

{
  png_byte pVar1;
  size_t sVar2;
  size_t pos_4;
  char message_4 [128];
  size_t pos_3;
  char message_3 [128];
  size_t pos_2;
  char message_2 [128];
  size_t pos_1;
  char message_1 [128];
  undefined1 local_110 [8];
  image_pixel test_pixel;
  size_t pos;
  char message [128];
  int i;
  png_infop pi_local;
  png_structp pp_local;
  transform_display *dp_local;
  
  standard_info_part1(&dp->this,pp,pi);
  (*dp->transform_list->set)(dp->transform_list,dp,pp,pi);
  message._124_4_ = (dp->this).use_update_info;
  do {
    png_read_update_info(pp,pi);
    message._124_4_ = message._124_4_ + -1;
  } while (0 < (int)message._124_4_);
  standard_info_part2(&dp->this,pp,pi,1);
  pVar1 = png_get_color_type(pp,pi);
  dp->output_colour_type = pVar1;
  pVar1 = png_get_bit_depth(pp);
  dp->output_bit_depth = pVar1;
  if ((7 < dp->output_bit_depth) &&
     (((dp->output_colour_type == '\x02' || (dp->output_colour_type == '\0')) &&
      ((dp->this).filler != '\0')))) {
    dp->output_colour_type = dp->output_colour_type | 4;
  }
  if (dp->output_colour_type == '\0') {
LAB_001145d6:
    if (((dp->output_bit_depth == '\x01') || (dp->output_bit_depth == '\x02')) ||
       (dp->output_bit_depth == '\x04')) goto LAB_001146e1;
LAB_0011460d:
    if ((dp->output_bit_depth == '\b') || (dp->output_bit_depth == '\x10')) goto LAB_001146e1;
  }
  else {
    if (dp->output_colour_type != '\x03') goto LAB_0011460d;
    if (dp->output_bit_depth < 9) goto LAB_001145d6;
  }
  test_pixel._88_8_ = safecat((char *)&pos,0x80,0,"invalid final bit depth: colour type(");
  test_pixel._88_8_ = safecatn((char *)&pos,0x80,test_pixel._88_8_,(uint)dp->output_colour_type);
  test_pixel._88_8_ = safecat((char *)&pos,0x80,test_pixel._88_8_,") with bit depth: ");
  test_pixel._88_8_ = safecatn((char *)&pos,0x80,test_pixel._88_8_,(uint)dp->output_bit_depth);
  png_error(pp);
LAB_001146e1:
  memset(local_110,0,0x60);
  test_pixel.alpha._0_1_ = (dp->this).colour_type;
  test_pixel.alpha._1_1_ = (dp->this).bit_depth;
  test_pixel.alpha._2_1_ = test_pixel.alpha._1_1_;
  if ((byte)test_pixel.alpha == 3) {
    test_pixel.alpha._2_1_ = 8;
  }
  test_pixel.alpha._3_1_ = test_pixel.alpha._3_1_ & 0xfe | (dp->this).is_transparent != 0;
  test_pixel.alphae._3_1_ = test_pixel.alpha._2_1_;
  test_pixel.alphae._2_1_ = test_pixel.alpha._2_1_;
  test_pixel.alphae._1_1_ = test_pixel.alpha._2_1_;
  test_pixel.alphae._0_1_ = test_pixel.alpha._2_1_;
  (*dp->transform_list->mod)(dp->transform_list,(image_pixel *)local_110,pp,dp);
  if ((byte)test_pixel.alpha != dp->output_colour_type) {
    sVar2 = safecat((char *)&pos_1,0x80,0,"colour type ");
    sVar2 = safecatn((char *)&pos_1,0x80,sVar2,(uint)dp->output_colour_type);
    sVar2 = safecat((char *)&pos_1,0x80,sVar2," expected ");
    safecatn((char *)&pos_1,0x80,sVar2,(uint)(byte)test_pixel.alpha);
    png_error(pp,&pos_1);
  }
  if (test_pixel.alpha._1_1_ != dp->output_bit_depth) {
    sVar2 = safecat((char *)&pos_2,0x80,0,"bit depth ");
    sVar2 = safecatn((char *)&pos_2,0x80,sVar2,(uint)dp->output_bit_depth);
    sVar2 = safecat((char *)&pos_2,0x80,sVar2," expected ");
    safecatn((char *)&pos_2,0x80,sVar2,(uint)test_pixel.alpha._1_1_);
    png_error(pp,&pos_2);
  }
  if (((byte)test_pixel.alpha == 3) && (test_pixel.alpha._2_1_ != 8)) {
    png_error(pp,"pngvalid: internal: palette sample depth not 8");
  }
  if ((dp->unpacked != '\0') && (test_pixel.alpha._1_1_ != 8)) {
    png_error(pp,"pngvalid: internal: bad unpacked pixel depth");
  }
  if (((dp->unpacked == '\0') && ((byte)test_pixel.alpha != 3)) &&
     (test_pixel.alpha._1_1_ != test_pixel.alpha._2_1_)) {
    sVar2 = safecat((char *)&pos_3,0x80,0,"internal: sample depth ");
    sVar2 = safecatn((char *)&pos_3,0x80,sVar2,(uint)test_pixel.alpha._2_1_);
    sVar2 = safecat((char *)&pos_3,0x80,sVar2," expected ");
    safecatn((char *)&pos_3,0x80,sVar2,(uint)test_pixel.alpha._1_1_);
    png_error(pp,&pos_3);
  }
  if (test_pixel.alpha._1_1_ != dp->output_bit_depth) {
    sVar2 = safecat((char *)&pos_4,0x80,0,"internal: bit depth ");
    sVar2 = safecatn((char *)&pos_4,0x80,sVar2,(uint)dp->output_bit_depth);
    sVar2 = safecat((char *)&pos_4,0x80,sVar2," expected ");
    safecatn((char *)&pos_4,0x80,sVar2,(uint)test_pixel.alpha._1_1_);
    png_error(pp,&pos_4);
  }
  return;
}

Assistant:

static void
transform_info_imp(transform_display *dp, png_structp pp, png_infop pi)
{
   /* Reuse the standard stuff as appropriate. */
   standard_info_part1(&dp->this, pp, pi);

   /* Now set the list of transforms. */
   dp->transform_list->set(dp->transform_list, dp, pp, pi);

   /* Update the info structure for these transforms: */
   {
      int i = dp->this.use_update_info;
      /* Always do one call, even if use_update_info is 0. */
      do
         png_read_update_info(pp, pi);
      while (--i > 0);
   }

   /* And get the output information into the standard_display */
   standard_info_part2(&dp->this, pp, pi, 1/*images*/);

   /* Plus the extra stuff we need for the transform tests: */
   dp->output_colour_type = png_get_color_type(pp, pi);
   dp->output_bit_depth = png_get_bit_depth(pp, pi);

   /* If png_set_filler is in action then fake the output color type to include
    * an alpha channel where appropriate.
    */
   if (dp->output_bit_depth >= 8 &&
       (dp->output_colour_type == PNG_COLOR_TYPE_RGB ||
        dp->output_colour_type == PNG_COLOR_TYPE_GRAY) && dp->this.filler)
       dp->output_colour_type |= 4;

   /* Validate the combination of colour type and bit depth that we are getting
    * out of libpng; the semantics of something not in the PNG spec are, at
    * best, unclear.
    */
   switch (dp->output_colour_type)
   {
   case PNG_COLOR_TYPE_PALETTE:
      if (dp->output_bit_depth > 8) goto error;
      /* FALLTHROUGH */
   case PNG_COLOR_TYPE_GRAY:
      if (dp->output_bit_depth == 1 || dp->output_bit_depth == 2 ||
         dp->output_bit_depth == 4)
         break;
      /* FALLTHROUGH */
   default:
      if (dp->output_bit_depth == 8 || dp->output_bit_depth == 16)
         break;
      /* FALLTHROUGH */
   error:
      {
         char message[128];
         size_t pos;

         pos = safecat(message, sizeof message, 0,
            "invalid final bit depth: colour type(");
         pos = safecatn(message, sizeof message, pos, dp->output_colour_type);
         pos = safecat(message, sizeof message, pos, ") with bit depth: ");
         pos = safecatn(message, sizeof message, pos, dp->output_bit_depth);

         png_error(pp, message);
      }
   }

   /* Use a test pixel to check that the output agrees with what we expect -
    * this avoids running the whole test if the output is unexpected.  This also
    * checks for internal errors.
    */
   {
      image_pixel test_pixel;

      memset(&test_pixel, 0, sizeof test_pixel);
      test_pixel.colour_type = dp->this.colour_type; /* input */
      test_pixel.bit_depth = dp->this.bit_depth;
      if (test_pixel.colour_type == PNG_COLOR_TYPE_PALETTE)
         test_pixel.sample_depth = 8;
      else
         test_pixel.sample_depth = test_pixel.bit_depth;
      /* Don't need sBIT here, but it must be set to non-zero to avoid
       * arithmetic overflows.
       */
      test_pixel.have_tRNS = dp->this.is_transparent != 0;
      test_pixel.red_sBIT = test_pixel.green_sBIT = test_pixel.blue_sBIT =
         test_pixel.alpha_sBIT = test_pixel.sample_depth;

      dp->transform_list->mod(dp->transform_list, &test_pixel, pp, dp);

      if (test_pixel.colour_type != dp->output_colour_type)
      {
         char message[128];
         size_t pos = safecat(message, sizeof message, 0, "colour type ");

         pos = safecatn(message, sizeof message, pos, dp->output_colour_type);
         pos = safecat(message, sizeof message, pos, " expected ");
         pos = safecatn(message, sizeof message, pos, test_pixel.colour_type);

         png_error(pp, message);
      }

      if (test_pixel.bit_depth != dp->output_bit_depth)
      {
         char message[128];
         size_t pos = safecat(message, sizeof message, 0, "bit depth ");

         pos = safecatn(message, sizeof message, pos, dp->output_bit_depth);
         pos = safecat(message, sizeof message, pos, " expected ");
         pos = safecatn(message, sizeof message, pos, test_pixel.bit_depth);

         png_error(pp, message);
      }

      /* If both bit depth and colour type are correct check the sample depth.
       */
      if (test_pixel.colour_type == PNG_COLOR_TYPE_PALETTE &&
          test_pixel.sample_depth != 8) /* oops - internal error! */
         png_error(pp, "pngvalid: internal: palette sample depth not 8");
      else if (dp->unpacked && test_pixel.bit_depth != 8)
         png_error(pp, "pngvalid: internal: bad unpacked pixel depth");
      else if (!dp->unpacked && test_pixel.colour_type != PNG_COLOR_TYPE_PALETTE
              && test_pixel.bit_depth != test_pixel.sample_depth)
      {
         char message[128];
         size_t pos = safecat(message, sizeof message, 0,
            "internal: sample depth ");

         /* Because unless something has set 'unpacked' or the image is palette
          * mapped we expect the transform to keep sample depth and bit depth
          * the same.
          */
         pos = safecatn(message, sizeof message, pos, test_pixel.sample_depth);
         pos = safecat(message, sizeof message, pos, " expected ");
         pos = safecatn(message, sizeof message, pos, test_pixel.bit_depth);

         png_error(pp, message);
      }
      else if (test_pixel.bit_depth != dp->output_bit_depth)
      {
         /* This could be a libpng error too; libpng has not produced what we
          * expect for the output bit depth.
          */
         char message[128];
         size_t pos = safecat(message, sizeof message, 0,
            "internal: bit depth ");

         pos = safecatn(message, sizeof message, pos, dp->output_bit_depth);
         pos = safecat(message, sizeof message, pos, " expected ");
         pos = safecatn(message, sizeof message, pos, test_pixel.bit_depth);

         png_error(pp, message);
      }
   }
}